

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test_1(void)

{
  pointer this;
  double a;
  allocator<char> local_31;
  string local_30;
  unique_ptr<Calc,_std::default_delete<Calc>_> local_10;
  unique_ptr<Calc,_std::default_delete<Calc>_> calc;
  
  DefaultCalc();
  this = std::unique_ptr<Calc,_std::default_delete<Calc>_>::operator->(&local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"1 2 3 42",&local_31);
  a = Calc::eval(this,&local_30);
  AssertEqD(a,42.0,0x30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::unique_ptr<Calc,_std::default_delete<Calc>_>::~unique_ptr(&local_10);
  return;
}

Assistant:

void test_1() {
  auto calc = DefaultCalc();
  AssertEqD(calc->eval("1 2 3 42"), 42.0, __LINE__);
}